

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool SetWrapAttr(TidyDocImpl *doc,uint indent,int attrStart,int strStart)

{
  uint uVar1;
  Bool BVar2;
  TidyIndent *pTVar3;
  Bool wrap;
  TidyIndent *ind;
  TidyPrintImpl *pprint;
  int strStart_local;
  int attrStart_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  pTVar3 = (doc->pprint).indent;
  BVar2 = (Bool)((ulong)(indent + (doc->pprint).linelen) < (doc->config).value[0x5d].v);
  if (BVar2 == no) {
    if ((doc->pprint).ixInd == 0) {
      (doc->pprint).indent[1].spaces = indent;
      (doc->pprint).ixInd = 1;
      CarryOver(&(doc->pprint).indent[1].attrStringStart,&(doc->pprint).indent[0].attrStringStart,
                (doc->pprint).wraphere);
      CarryOver(&(doc->pprint).indent[1].attrValStart,&(doc->pprint).indent[0].attrValStart,
                (doc->pprint).wraphere);
    }
  }
  else {
    if (pTVar3->spaces < 0) {
      pTVar3->spaces = indent;
    }
    (doc->pprint).wraphere = (doc->pprint).linelen;
  }
  uVar1 = (doc->pprint).ixInd;
  pTVar3[uVar1].attrValStart = attrStart;
  pTVar3[uVar1].attrStringStart = strStart;
  return BVar2;
}

Assistant:

static Bool SetWrapAttr( TidyDocImpl* doc,
                         uint indent, int attrStart, int strStart )
{
    TidyPrintImpl* pprint = &doc->pprint;
    TidyIndent *ind = pprint->indent + 0;

    Bool wrap = ( indent + pprint->linelen < cfg(doc, TidyWrapLen) );
    if ( wrap )
    {
        if ( ind[0].spaces < 0 )
            ind[0].spaces = indent;
        pprint->wraphere = pprint->linelen;
    }
    else if ( pprint->ixInd == 0 )
    {
        /* Save indent 1st time we pass the the wrap line */
        pprint->indent[ 1 ].spaces = indent;
        pprint->ixInd = 1;

        /* Carry over string state */
        CarryOver( &ind[1].attrStringStart, &ind[0].attrStringStart, pprint->wraphere );
        CarryOver( &ind[1].attrValStart, &ind[0].attrValStart, pprint->wraphere );
    }
    ind += doc->pprint.ixInd;
    ind->attrValStart = attrStart;
    ind->attrStringStart = strStart;
    return wrap;
}